

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::dtime_t,duckdb::DatePart::EpochNanosecondsOperator,long>
          (DatePart *this,vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  char cVar1;
  reference stats;
  dtime_t dVar2;
  dtime_t dVar3;
  BaseStatistics result;
  Value local_e0 [64];
  LogicalType local_a0 [24];
  BaseStatistics local_88 [88];
  
  stats = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  cVar1 = duckdb::NumericStats::HasMinMax(stats);
  if (cVar1 != '\0') {
    dVar2 = NumericStats::GetMin<duckdb::dtime_t>(stats);
    dVar3 = NumericStats::GetMax<duckdb::dtime_t>(stats);
    if (dVar2.micros <= dVar3.micros) {
      duckdb::LogicalType::LogicalType(local_a0,stats_type);
      duckdb::NumericStats::CreateEmpty(local_88,local_a0);
      duckdb::LogicalType::~LogicalType(local_a0);
      duckdb::Value::Value(local_e0,dVar2.micros * 1000);
      duckdb::NumericStats::SetMin(local_88,local_e0);
      duckdb::Value::~Value(local_e0);
      duckdb::Value::Value(local_e0,dVar3.micros * 1000);
      duckdb::NumericStats::SetMax(local_88,local_e0);
      duckdb::Value::~Value(local_e0);
      vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
      duckdb::BaseStatistics::CopyValidity(local_88);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(local_88);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}